

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O1

void walk_stack(StackWord *start68k)

{
  StackWord *pSVar1;
  DLword DVar2;
  StackWord SVar3;
  ushort uVar4;
  long lVar5;
  bool bVar6;
  DLword *pDVar7;
  uint uVar8;
  Bframe *bf;
  char *pcVar9;
  FX *fx;
  ulong uVar10;
  DLword *pDVar11;
  StackWord *pSVar12;
  StackWord *pSVar13;
  DLword local_42;
  undefined2 local_40;
  undefined2 local_3e;
  
  DVar2 = MachineState.pvar[-5];
  uVar10 = (long)MachineState.csp - (long)Stackspace >> 1;
  if (0xffff < uVar10) {
    printf("Stack offset is out of range: 0x%tx\n",uVar10);
  }
  if ((DVar2 == (DLword)uVar10) && (MachineState.csp[1] == 0xa000)) {
    bVar6 = true;
  }
  else {
    if (MachineState.csp <= MachineState.pvar + -10) {
      warn("CURRENTFX >= CurrentStackPTR??\n");
      pDVar11 = MachineState.pvar + -10;
      if (((ulong)pDVar11 & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",pDVar11);
      }
      pDVar7 = MachineState.csp;
      lVar5 = CONCAT44(Lisp_world._4_4_,(int)Lisp_world);
      if (((ulong)MachineState.csp & 1) != 0) {
        printf("Misaligned pointer in LAddrFromNative %p\n",MachineState.csp);
      }
      printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n",
             (ulong)((long)pDVar11 - lVar5) >> 1 & 0xffffffff,
             (ulong)((long)pDVar7 - CONCAT44(Lisp_world._4_4_,(int)Lisp_world)) >> 1 & 0xffffffff);
    }
    puts("set CURRENTFX->nextblock in debugger. But it will be reset after this check ");
    local_42 = MachineState.pvar[-5];
    local_40 = *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2);
    local_3e = *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2);
    uVar10 = (long)(MachineState.csp + 2) - (long)Stackspace >> 1;
    if (0xffff < uVar10) {
      printf("Stack offset is out of range: 0x%tx\n",uVar10);
    }
    MachineState.pvar[-5] = (DLword)uVar10;
    *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = 0xa000;
    *(short *)((ulong)(MachineState.csp + 3) ^ 2) =
         (short)(((int)MachineState.endofstack - (int)MachineState.csp) - 4U >> 1);
    bVar6 = false;
  }
  if (start68k == (StackWord *)0x0) {
    uVar10 = (ulong)InterfacePage->stackbase;
    pSVar12 = (StackWord *)(Stackspace + uVar10);
    pcVar9 = "Stack base = 0x%tx.";
  }
  else {
    pSVar12 = (StackWord *)((ulong)start68k & 0xfffffffffffffffe);
    uVar10 = (long)pSVar12 - (long)Stackspace >> 1;
    pcVar9 = "Starting at 0x%tx.";
  }
  printf(pcVar9,uVar10);
  pSVar13 = (StackWord *)((ulong)((uint)InterfacePage->endofstack * 2) + (long)Stackspace);
  printf("  End of stack = 0x%tx.\n\n");
  if (*(ushort *)((ulong)pSVar13 ^ 2) >> 0xd != 7) {
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n",pSVar13);
  }
  do {
    if (pSVar13 <= pSVar12) {
      puts("\nStack Check done");
      if (!bVar6) {
        MachineState.pvar[-5] = local_42;
        *(undefined2 *)((ulong)(MachineState.csp + 2) ^ 2) = local_40;
        *(undefined2 *)((ulong)(MachineState.csp + 3) ^ 2) = local_3e;
      }
      return;
    }
    uVar4 = *(ushort *)((ulong)pSVar12 ^ 2) >> 0xd;
    if (uVar4 == 5) {
      SVar3 = *pSVar12;
      pcVar9 = "%04tx:  Free block (len %d/0x%x)\n";
LAB_0012c688:
      uVar10 = (ulong)(ushort)SVar3;
      printf(pcVar9,(long)pSVar12 - (long)Stackspace >> 1,uVar10,uVar10);
      if (SVar3 == (StackWord)0x0) {
        uVar10 = 2;
      }
      pSVar12 = pSVar12 + uVar10;
    }
    else {
      if (uVar4 != 6) {
        if (uVar4 != 7) {
          uVar4 = *(ushort *)((ulong)pSVar12 ^ 2);
          do {
            if (0x1fff < uVar4) {
              printf("%04tx:  Bad BF IVAR 0x%x\n",(long)pSVar12 - (long)Stackspace >> 1,(ulong)uVar4
                     ,(ulong)(ushort)-(uVar4 & 0xe000));
            }
            pSVar12 = pSVar12 + 2;
            uVar4 = *(ushort *)((ulong)pSVar12 ^ 2);
          } while( true );
        }
        SVar3 = *pSVar12;
        pcVar9 = "%04tx:  Guard block (len %d/0x%x)\n";
        goto LAB_0012c688;
      }
      printf("%04tx:  ",(long)pSVar12 - (long)Stackspace >> 1);
      uVar8 = *(uint *)(pSVar12 + 2);
      if ((uVar8 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar8);
      }
      print(*(uint *)(CONCAT44(Lisp_world._4_4_,(int)Lisp_world) + 8 + (ulong)uVar8 * 2) & 0xfffffff
           );
      printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n",(ulong)(ushort)*pSVar12,
             (ulong)(ushort)pSVar12[8],(ulong)(ushort)pSVar12[5]);
      pSVar1 = pSVar12 + -2;
      uVar10 = (long)pSVar1 - (long)Stackspace >> 1;
      if (0xffff < uVar10) {
        printf("Stack offset is out of range: 0x%tx\n",uVar10);
      }
      if (((ushort)*pSVar12 & 1) == 0) {
        if (((ulong)pSVar1 & 1) != 0) {
          printf("Misaligned pointer in LAddrFromNative %p\n",pSVar1);
        }
        uVar8 = (uint)((int)pSVar1 - (int)Lisp_world) >> 1 & 0xffff;
      }
      else {
        uVar8 = (uint)(ushort)pSVar12[9];
      }
      if (uVar8 != ((uint)uVar10 & 0xffff)) {
        if (((ushort)*pSVar12 & 1) == 0) {
          if (((ulong)pSVar1 & 1) != 0) {
            printf("Misaligned pointer in LAddrFromNative %p\n",pSVar1);
          }
          uVar8 = (uint)((int)pSVar1 - (int)Lisp_world) >> 1;
        }
        else {
          uVar8 = (uint)(ushort)pSVar12[9];
        }
        if ((uVar8 & 1) != 0) {
          printf("Misaligned StackOffset in NativeAligned4FromStackOffset 0x%hx\n",
                 (ulong)(uVar8 & 0xffff));
        }
        if (((pSVar12[-1].field_0x1 & 2) == 0) ||
           (*pSVar1 != *(StackWord *)(Stackspace + (uVar8 & 0xffff)))) {
          puts("       [Bad residual]");
        }
      }
      pSVar12 = (StackWord *)((ulong)((uint)(ushort)pSVar12[5] * 2) + (long)Stackspace);
    }
    if ((pSVar12 != start68k) && (pSVar13 < pSVar12)) {
      warn("scanptr exceeded end stack");
      printf("scanptr68k=%p endstack68k=%p",pSVar12,pSVar13);
    }
  } while( true );
}

Assistant:

void walk_stack(StackWord *start68k) {
  StackWord *scanptr68k;
  StackWord *endstack68k;
  DLword *top_ivar;
  DLword save_nextblock;
  DLword savestack1, savestack2;
  DLword setflg = NIL;
  DLword freesize;

  if ((CURRENTFX->nextblock != StackOffsetFromNative(CurrentStackPTR)) || (!FSBP(CurrentStackPTR))) {
    if ((DLword *)CURRENTFX >= CurrentStackPTR) {
      WARN("CURRENTFX >= CurrentStackPTR??\n",
           printf("CURRENTFX=0x%x,CurrentStackPTR=0x%x\n", LAddrFromNative(CURRENTFX),
                  LAddrFromNative(CurrentStackPTR)));
    }
    setflg = T;
    printf("set CURRENTFX->nextblock in debugger. But it will be reset after this check \n");
    save_nextblock = CURRENTFX->nextblock;
    savestack1 = GETWORD(CurrentStackPTR + 2);
    savestack2 = GETWORD(CurrentStackPTR + 3);
    CURRENTFX->nextblock = StackOffsetFromNative(CurrentStackPTR + 2);
    GETWORD(CurrentStackPTR + 2) = STK_FSB_WORD;
    GETWORD(CurrentStackPTR + 3) = (((UNSIGNED)EndSTKP - (UNSIGNED)(CurrentStackPTR + 2)) >> 1);
  }

  /* Start from where caller specifies, (as real address!); if addr=0 */
  /* start from stackbase. */

  if (start68k) {
    scanptr68k = (StackWord *)((unsigned long)start68k & -2);
    printf("Starting at 0x%tx.", (DLword *)scanptr68k - Stackspace);
  } else {
    scanptr68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->stackbase);
    printf("Stack base = 0x%tx.", (DLword *)scanptr68k - Stackspace);
  }

  endstack68k = (StackWord *)NativeAligned2FromStackOffset(InterfacePage->endofstack);

  printf("  End of stack = 0x%tx.\n\n", (DLword *)endstack68k - Stackspace);

  if (STKWORD(endstack68k)->flags != STK_GUARD)
    printf("?? endstack is not GUARD BLK\nendstack = %p, flags = %d\n\n", (void *)endstack68k,
           STKWORD(endstack68k)->flags);

  while (scanptr68k < endstack68k) {
    switch ((unsigned)(STKWORD(scanptr68k)->flags)) {
      /* Free stack block */
      case STK_FSB:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Free block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);

        if (freesize == 0) { freesize = 2; }

        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_GUARD:
        freesize = FSB_size(scanptr68k);
        printf("%04tx:  Guard block (len %d/0x%x)\n", (DLword *)scanptr68k - Stackspace, freesize,
               freesize);
        if (freesize == 0) { freesize = 2; }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + freesize);

        break;

      case STK_FX:
        CHECK_FX((FX *)scanptr68k);

        printf("%04tx:  ", (DLword *)scanptr68k - Stackspace);

        {
          FX *fx = (FX *)scanptr68k;
          struct fnhead *fnobj;
#ifdef BIGVM
          fnobj = (struct fnhead *)NativeAligned4FromLAddr(fx->fnheader);
#else
          fnobj =
              (struct fnhead *)NativeAligned4FromLAddr(((int)fx->hi2fnheader << 16) | fx->lofnheader);
#endif /* BIGVM */
          print(fnobj->framename);
          printf("\talink: 0x%04x, clink: 0x%04x, next: 0x%04x\n", fx->alink, fx->clink,
                 fx->nextblock);
        }

        {
          Bframe *dummybf, *mtmp;
          int mblink;

          /* Now make sure the FX is connected to */
          /* a Basic Frame.                       */

          dummybf = (Bframe *)DUMMYBF(scanptr68k);

          /* Check for connection via BLINK field: */
          if (StackOffsetFromNative(dummybf) != GETBLINK(scanptr68k)) {
            mblink = GETBLINK(scanptr68k);
            mtmp = (Bframe *)NativeAligned4FromStackOffset(mblink);
            if ((dummybf->residual == NIL) || (dummybf->ivar != mtmp->ivar))
              printf("       [Bad residual]\n");
          }
        }

        scanptr68k = (StackWord *)NativeAligned2FromStackOffset(((FX *)scanptr68k)->nextblock);
        break;

      default:
        top_ivar = (DLword *)scanptr68k;
        while (STKWORD(scanptr68k)->flags != STK_BF) {
          if (STKWORD(scanptr68k)->flags != STK_NOTFLG) {
            printf("%04tx:  Bad BF IVAR 0x%x\n", (DLword *)scanptr68k - Stackspace,
                   GETWORD((DLword *)scanptr68k));
          }
          scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        } /* while end */
        /* CHECK_BF(scanptr68k); */
        {
          Bframe *bf = (Bframe *)scanptr68k;
          printf("%04tx:  BF  usecnt %d, resid %d, padding %d, ivar 0x%04x\n",
                 (DLword *)scanptr68k - Stackspace, bf->usecnt, bf->residual, bf->padding,
                 bf->ivar);

          if (((Bframe *)scanptr68k)->ivar != StackOffsetFromNative(top_ivar))
            printf("       [but top_ivar = 0x%04tx]\n", top_ivar - Stackspace);
        }
        scanptr68k = (StackWord *)((DLword *)scanptr68k + DLWORDSPER_CELL);
        break;

    } /*switch end */

    if (scanptr68k != start68k) {
      if (scanptr68k > endstack68k) {
        WARN("scanptr exceeded end stack",
             printf("scanptr68k=%p endstack68k=%p", (void *)scanptr68k, (void *)endstack68k));
      }
    }
  } /* while end */

#ifdef FSBCHECK
  if (bigFSBindex != 0) {
    int i;

    printf("\nBIG FSB(s):\n");

    for (i = 0; i < bigFSBindex; i++) {
      printf("Offset: 0x%x , Size: 0x%x\n", bigFSB[i].offset, bigFSB[i].size);
    }
  }
#endif
  printf("\nStack Check done\n");
  if (setflg) {
    CURRENTFX->nextblock = save_nextblock;
    GETWORD(CurrentStackPTR + 2) = savestack1;
    GETWORD(CurrentStackPTR + 3) = savestack2;
  }

}